

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

_Bool filelog_init(char *filename)

{
  FILE *pFVar1;
  int *piVar2;
  char *pcVar3;
  
  pFVar1 = fopen("log.log","w+");
  if (pFVar1 == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    log_log(4,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/log.c",
            0x84,"%s:%s","log file open error:",pcVar3);
    *piVar2 = 0;
  }
  else {
    has_init_file = 1;
    FILE_LOGGING.udata = pFVar1;
  }
  return pFVar1 != (FILE *)0x0;
}

Assistant:

bool filelog_init(const char *filename) {
  FILE *fp;
  // char error_buffer[36];
  
  if ((fp = fopen("log.log", "w+"))==NULL){
    log_error_shortcut("log file open error:");
      return false;
    }
  FILE_LOGGING.udata = fp;
  has_init_file = 1;
  return true;
}